

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

char * __thiscall
flatbuffers::JsonPrinter::
PrintContainer<flatbuffers::Vector<flatbuffers::Offset<void>,unsigned_int>,unsigned_int>
          (JsonPrinter *this,uint *param_2,uint param_3,Type *param_4,int param_5,uint8_t *param_6)

{
  char cVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  char *pcVar8;
  bool bVar9;
  
  pcVar6 = (char *)(ulong)param_3;
  cVar1 = '\0';
  if (param_4->base_type == BASE_TYPE_STRUCT) {
    cVar1 = param_4->struct_def->fixed;
  }
  iVar2 = this->opts->indent_step;
  iVar7 = 0;
  if (0 < iVar2) {
    iVar7 = iVar2;
  }
  std::__cxx11::string::push_back((char)this->text);
  if (-1 < this->opts->indent_step) {
    std::__cxx11::string::push_back((char)this->text);
  }
  bVar9 = param_3 != 0;
  pcVar5 = pcVar6;
  if (bVar9) {
    pcVar8 = (char *)0x0;
    do {
      if (pcVar8 != (char *)0x0) {
        if (this->opts->protobuf_ascii_alike == false) {
          std::__cxx11::string::push_back((char)this->text);
        }
        if (-1 < this->opts->indent_step) {
          std::__cxx11::string::push_back((char)this->text);
        }
      }
      std::__cxx11::string::_M_replace_aux
                ((ulong)this->text,this->text->_M_string_length,0,(char)(iVar7 + param_5));
      if (cVar1 == '\0') {
        if ((char *)(ulong)*param_2 <= pcVar8) {
          __assert_fail("i < size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                        ,0xc1,
                        "return_type flatbuffers::Vector<flatbuffers::Offset<>>::Get(SizeT) const [T = flatbuffers::Offset<>, SizeT = unsigned int]"
                       );
        }
        uVar4 = (ulong)(uint)((int)pcVar8 * 4);
        lVar3 = (ulong)*(uint *)((long)param_2 + uVar4 + 4) + uVar4 + 4;
      }
      else {
        lVar3 = param_4->struct_def->bytesize * (long)pcVar8 + 4;
      }
      pcVar5 = PrintOffset(this,(void *)((long)param_2 + lVar3),param_4,iVar7 + param_5,param_6,
                           (int)pcVar8);
      if (pcVar5 != (char *)0x0) break;
      pcVar8 = pcVar8 + 1;
      bVar9 = pcVar8 < pcVar6;
      pcVar5 = pcVar6;
    } while (pcVar8 != pcVar6);
  }
  if (!bVar9) {
    if (-1 < this->opts->indent_step) {
      std::__cxx11::string::push_back((char)this->text);
    }
    pcVar5 = (char *)0x0;
    std::__cxx11::string::_M_replace_aux
              ((ulong)this->text,this->text->_M_string_length,0,(char)param_5);
    std::__cxx11::string::push_back((char)this->text);
  }
  return pcVar5;
}

Assistant:

const char *PrintContainer(PrintPointerTag, const Container &c, SizeT size,
                             const Type &type, int indent,
                             const uint8_t *prev_val) {
    const auto is_struct = IsStruct(type);
    const auto elem_indent = indent + Indent();
    text += '[';
    AddNewLine();
    for (SizeT i = 0; i < size; i++) {
      if (i) {
        AddComma();
        AddNewLine();
      }
      AddIndent(elem_indent);
      auto ptr = is_struct ? reinterpret_cast<const void *>(
                                 c.Data() + type.struct_def->bytesize * i)
                           : c[i];
      auto err = PrintOffset(ptr, type, elem_indent, prev_val,
                             static_cast<soffset_t>(i));
      if (err) return err;
    }
    AddNewLine();
    AddIndent(indent);
    text += ']';
    return nullptr;
  }